

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::operator*(mat4 *__return_storage_ptr__,float_t s,mat4 *m)

{
  float_t fVar1;
  vec4 *pvVar2;
  vec4 local_58;
  vec4 local_48;
  vec4 local_38;
  vec4 local_28;
  mat4 *local_18;
  mat4 *m_local;
  float_t s_local;
  
  local_18 = m;
  m_local._4_4_ = s;
  pvVar2 = mat4::operator[](m,0);
  local_28 = operator*(s,pvVar2);
  fVar1 = m_local._4_4_;
  pvVar2 = mat4::operator[](local_18,1);
  local_38 = operator*(fVar1,pvVar2);
  fVar1 = m_local._4_4_;
  pvVar2 = mat4::operator[](local_18,2);
  local_48 = operator*(fVar1,pvVar2);
  fVar1 = m_local._4_4_;
  pvVar2 = mat4::operator[](local_18,3);
  local_58 = operator*(fVar1,pvVar2);
  mat4::mat4(__return_storage_ptr__,&local_28,&local_38,&local_48,&local_58);
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const float_t s, const mat4& m)
{
    return mat4(s * m[0], s * m[1], s * m[2], s * m[3]);
}